

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int compare_dir_entries(void *p1,void *p2)

{
  char cVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  bool bVar9;
  bool bVar10;
  
  pcVar8 = "na";
  if (*(char **)(*p1 + 0x20) != (char *)0x0) {
    pcVar8 = *(char **)(*p1 + 0x20);
  }
  uVar5 = *(uint *)((long)p2 + 0x28) & 0xf000;
  if ((*(uint *)((long)p1 + 0x28) & 0xf000) == 0x4000) {
    if (uVar5 != 0x4000) {
      return -1;
    }
  }
  else if (uVar5 == 0x4000) {
    return 1;
  }
  cVar1 = *pcVar8;
  if (cVar1 == 'd') {
    lVar2 = *(long *)((long)p1 + 0x68);
    lVar3 = *(long *)((long)p2 + 0x68);
    bVar10 = SBORROW8(lVar2,lVar3);
    lVar4 = lVar2 - lVar3;
    bVar9 = lVar2 == lVar3;
  }
  else {
    if (cVar1 != 's') {
      iVar6 = 0;
      if (cVar1 == 'n') {
        iVar6 = strcmp(*(char **)((long)p1 + 8),*(char **)((long)p2 + 8));
      }
      goto LAB_0010aab4;
    }
    lVar2 = *(long *)((long)p1 + 0x40);
    lVar3 = *(long *)((long)p2 + 0x40);
    bVar10 = SBORROW8(lVar2,lVar3);
    lVar4 = lVar2 - lVar3;
    bVar9 = lVar2 == lVar3;
  }
  bVar10 = !bVar9 && bVar10 == lVar4 < 0;
  iVar6 = (bVar10 - 1) + (uint)bVar10;
  if (bVar9) {
    iVar6 = 0;
  }
LAB_0010aab4:
  iVar7 = -iVar6;
  if (pcVar8[1] != 'd') {
    iVar7 = iVar6;
  }
  return iVar7;
}

Assistant:

static int __cdecl compare_dir_entries(const void *p1, const void *p2) {
  const struct dir_entry *a = (const struct dir_entry *) p1,
        *b = (const struct dir_entry *) p2;
  const char *qs = a->conn->mg_conn.query_string ?
    a->conn->mg_conn.query_string : "na";
  int cmp_result = 0;

  if (S_ISDIR(a->st.st_mode) && !S_ISDIR(b->st.st_mode)) {
    return -1;  // Always put directories on top
  } else if (!S_ISDIR(a->st.st_mode) && S_ISDIR(b->st.st_mode)) {
    return 1;   // Always put directories on top
  } else if (*qs == 'n') {
    cmp_result = strcmp(a->file_name, b->file_name);
  } else if (*qs == 's') {
    cmp_result = a->st.st_size == b->st.st_size ? 0 :
      a->st.st_size > b->st.st_size ? 1 : -1;
  } else if (*qs == 'd') {
    cmp_result = a->st.st_mtime == b->st.st_mtime ? 0 :
      a->st.st_mtime > b->st.st_mtime ? 1 : -1;
  }

  return qs[1] == 'd' ? -cmp_result : cmp_result;
}